

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

int CompareDouble(double a,double b)

{
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  double b_local;
  double a_local;
  
  if (b <= a) {
    if (a <= b) {
      if ((a != b) || (NAN(a) || NAN(b))) {
        local_24 = CompareNans(a,b);
      }
      else {
        local_24 = 0;
      }
      local_20 = local_24;
    }
    else {
      local_20 = 1;
    }
    local_1c = local_20;
  }
  else {
    local_1c = -1;
  }
  return local_1c;
}

Assistant:

static int CompareDouble( double a, double b )
{
  return ( ( a < b ) ? -1 : ((a > b) ? 1 : (a==b ? 0 : CompareNans(a,b)) ) );
}